

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ChangeSegmentProtection
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,DWORD protectFlags,
          DWORD expectedOldProtectFlags)

{
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *pPVar6;
  HANDLE pVVar7;
  char *pcVar8;
  undefined8 *in_FS_OFFSET;
  byte local_89;
  undefined1 local_68 [4];
  BOOL fSuccess;
  MEMORY_BASIC_INFORMATION info;
  DWORD oldProtect;
  DWORD regionSize;
  char *endAddress;
  char *address;
  char *segmentEndAddress;
  DWORD expectedOldProtectFlags_local;
  DWORD protectFlags_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  pPVar6 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                     (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
  pVVar1 = pPVar6->processHandle;
  pVVar7 = GetCurrentProcess();
  if (pVVar1 != pVVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x203,"(this->GetAllocator()->processHandle == GetCurrentProcess())",
                       "this->GetAllocator()->processHandle == GetCurrentProcess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pcVar8 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  pPVar6 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                     (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
  uVar4 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ::GetMaxAllocPageCount(pPVar6);
  pcVar8 = pcVar8 + (uVar4 << 0xc);
  endAddress = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  do {
    if (pcVar8 <= endAddress) {
      return;
    }
    bVar3 = IsFreeOrDecommitted(this,endAddress);
    if (!bVar3) {
      _oldProtect = endAddress;
      do {
        _oldProtect = _oldProtect + 0x1000;
        local_89 = 0;
        if (_oldProtect < pcVar8) {
          bVar3 = IsFreeOrDecommitted(this,_oldProtect);
          local_89 = bVar3 ^ 0xff;
        }
      } while ((local_89 & 1) != 0);
      if (0xfffffffe < (ulong)((long)_oldProtect - (long)endAddress)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x211,"(((uintptr_t)(endAddress - address)) < (2147483647 *2U +1U))",
                           "((uintptr_t)(endAddress - address)) < UINT_MAX");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      info._44_4_ = (int)_oldProtect - (int)endAddress;
      info.Type = 0;
      memset(local_68,0,0x30);
      VirtualQuery(endAddress,(PMEMORY_BASIC_INFORMATION)local_68,0x30);
      if (info.RegionSize._4_4_ != expectedOldProtectFlags) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x218,"(info.Protect == expectedOldProtectFlags)",
                           "info.Protect == expectedOldProtectFlags");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      BVar5 = VirtualProtect(endAddress,(ulong)(uint)info._44_4_,protectFlags,&info.Type);
      if (BVar5 != 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x21c,"(fSuccess == 1)","fSuccess == TRUE");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      endAddress = _oldProtect;
      if (info.Type != expectedOldProtectFlags) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x21d,"(oldProtect == expectedOldProtectFlags)",
                           "oldProtect == expectedOldProtectFlags");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
    }
    endAddress = endAddress + 0x1000;
  } while( true );
}

Assistant:

void
PageSegmentBase<T>::ChangeSegmentProtection(DWORD protectFlags, DWORD expectedOldProtectFlags)
{
    // TODO: There is a discrepancy in PageSegmentBase
    // The segment page count is initialized in PageSegmentBase::Initialize. It takes into account
    // the guard pages + any additional pages for alignment.
    // However, the free page count is calculated for the segment before initialize is called.
    // In practice, what happens is the following. The initial segment page count is 256. This
    // ends up being the free page count too. When initialize is called, we allocate the guard
    // pages and the alignment pages, which causes the total page count to be 272. The segment
    // page count is then calculated as total - guard, which means 256 <= segmentPageCount < totalPageCount
    // The code in PageSegment's constructor will mark the pages between 256 and 272 as in use,
    // which is why it generally works. However, it breaks in the case where we want to know the end
    // address of the page. It should really be address + 256 * 4k but this->GetEndAddress will return
    // a value greater than that. Need to do a pass through the counts and make sure that it's rational.
    // For now, simply calculate the end address from the allocator's page count
    Assert(this->GetAllocator()->processHandle == GetCurrentProcess());

    char* segmentEndAddress = this->address + (this->GetAllocator()->GetMaxAllocPageCount() * AutoSystemInfo::PageSize);

    for (char* address = this->address; address < segmentEndAddress; address += AutoSystemInfo::PageSize)
    {
        if (!IsFreeOrDecommitted(address))
        {
            char* endAddress = address;
            do
            {
                endAddress += AutoSystemInfo::PageSize;
            } while (endAddress < segmentEndAddress && !IsFreeOrDecommitted(endAddress));

            Assert(((uintptr_t)(endAddress - address)) < UINT_MAX);
            DWORD regionSize = (DWORD) (endAddress - address);
            DWORD oldProtect = 0;

#if DBG
            MEMORY_BASIC_INFORMATION info = { 0 };
            VirtualQuery(address, &info, sizeof(MEMORY_BASIC_INFORMATION));
            Assert(info.Protect == expectedOldProtectFlags);
#endif

            BOOL fSuccess = VirtualProtect(address, regionSize, protectFlags, &oldProtect);
            Assert(fSuccess == TRUE);
            Assert(oldProtect == expectedOldProtectFlags);

            address = endAddress;
        }
    }
}